

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryLevelsInstance::initTexture(TextureQueryLevelsInstance *this)

{
  TextureSpec *pTVar1;
  TestContext *this_00;
  IVec3 *this_01;
  MessageBuilder *pMVar2;
  IVec3 *textureSize;
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  *this_02;
  SharedPtr<vkt::sr::TextureBinding> local_370;
  MessageBuilder local_360;
  string local_1e0;
  MessageBuilder local_1b0;
  undefined1 local_30 [8];
  TextureBindingSp textureBinding;
  int numLevels;
  TestLog *log;
  TextureQueryLevelsInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  this_01 = (IVec3 *)tcu::TestContext::getLog(this_00);
  textureBinding.m_state._4_4_ = (this->m_testSize).lodBase + 1;
  textureSize = this_01;
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)local_30);
  tcu::TestLog::operator<<
            (&local_1b0,(TestLog *)this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [13])"Image size: ");
  sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
            (&local_1e0,
             (_anonymous_namespace_ *)
             (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type,(int)this + 0x218,
             textureSize);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1e0);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  tcu::TestLog::operator<<
            (&local_360,(TestLog *)this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [13])"Base level: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->m_testSize).lodBase);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  pTVar1 = (this->super_TextureQueryInstance).m_textureSpec;
  createEmptyTexture((anon_unknown_0 *)&local_370,pTVar1->format,pTVar1->type,
                     &(this->m_testSize).textureSize,textureBinding.m_state._4_4_,
                     (this->m_testSize).lodBase,&pTVar1->sampler);
  de::SharedPtr<vkt::sr::TextureBinding>::operator=
            ((SharedPtr<vkt::sr::TextureBinding> *)local_30,&local_370);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_370);
  this_02 = &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures;
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::clear(this_02);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(this_02,(value_type *)local_30);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)local_30)
  ;
  return;
}

Assistant:

void TextureQueryLevelsInstance::initTexture (void)
{
	tcu::TestLog&			log					= m_context.getTestContext().getLog();
	int						numLevels			= m_testSize.lodBase + 1;
	TextureBindingSp		textureBinding;

	log << tcu::TestLog::Message << "Image size: " << getTextureSizeString(m_textureSpec.type, m_testSize.textureSize) << tcu::TestLog::EndMessage;
	log << tcu::TestLog::Message << "Base level: " << m_testSize.lodBase << tcu::TestLog::EndMessage;

	textureBinding = createEmptyTexture(m_textureSpec.format, m_textureSpec.type, m_testSize.textureSize, numLevels, m_testSize.lodBase, m_textureSpec.sampler);

	m_textures.clear();
	m_textures.push_back(textureBinding);
}